

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O3

void kj::_::Debug::
     log<char_const(&)[93],kj::_::DebugComparison<capnp::schema::Type::Which,capnp::schema::Type::Which>&,capnp::schema::Type::Which,capnp::schema::Type::Which>
               (char *file,int line,LogSeverity severity,char *macroArgs,char (*params) [93],
               DebugComparison<capnp::schema::Type::Which,_capnp::schema::Type::Which> *params_1,
               Which *params_2,Which *params_3)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  ArrayPtr<kj::String> argValues_00;
  undefined4 in_register_00000014;
  long lVar4;
  String argValues [4];
  undefined1 in_stack_ffffffffffffff38 [14];
  Which WVar5;
  String local_b0;
  String local_98;
  char *local_80;
  size_t local_78;
  ArrayDisposer *pAStack_70;
  char *local_68;
  size_t local_60;
  ArrayDisposer *pAStack_58;
  char *local_50;
  size_t sStack_48;
  ArrayDisposer *pAStack_40;
  
  str<char_const(&)[93]>
            (&local_98,(kj *)params,(char (*) [93])CONCAT44(in_register_00000014,severity));
  _::operator*(&local_b0,params_1);
  local_80 = local_b0.content.ptr;
  local_78 = local_b0.content.size_;
  pAStack_70 = local_b0.content.disposer;
  str<unsigned_short>(&local_b0,(unsigned_short *)&stack0xffffffffffffff46);
  local_68 = local_b0.content.ptr;
  local_60 = local_b0.content.size_;
  pAStack_58 = local_b0.content.disposer;
  WVar5 = *params_3;
  str<unsigned_short>(&local_b0,(unsigned_short *)&stack0xffffffffffffff46);
  local_50 = local_b0.content.ptr;
  sStack_48 = local_b0.content.size_;
  pAStack_40 = local_b0.content.disposer;
  argValues_00.size_._6_2_ = WVar5;
  argValues_00._0_14_ = in_stack_ffffffffffffff38;
  logInternal((Debug *)file,(char *)(ulong)(uint)line,severity,(LogSeverity)macroArgs,
              (char *)&local_98,argValues_00);
  lVar4 = 0x48;
  do {
    lVar1 = *(long *)((long)&local_98.content.ptr + lVar4);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)((long)&local_98.content.size_ + lVar4);
      *(undefined8 *)((long)&local_98.content.ptr + lVar4) = 0;
      *(undefined8 *)((long)&local_98.content.size_ + lVar4) = 0;
      puVar3 = *(undefined8 **)((long)&local_98.content.disposer + lVar4);
      (**(code **)*puVar3)(puVar3,lVar1,1,uVar2,uVar2,0);
    }
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}